

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O1

void PushQuad(GUI *gui,mu_Rect dst,mu_Rect src,mu_Color color)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint32_t uVar5;
  long lVar6;
  uint32_t uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  if (gui->QuadCount == 0x4000) {
    Render(gui);
  }
  iVar1 = gui->QuadCount;
  lVar4 = (long)iVar1;
  uVar2 = iVar1 * 8;
  gui->QuadCount = iVar1 + 1;
  fVar9 = (float)src.x * 0.0078125;
  fVar10 = (float)src.y * 0.0078125;
  gui->UVArray[lVar4 * 8] = fVar9;
  gui->UVArray[(int)(uVar2 + 1)] = fVar10;
  fVar8 = (float)src.w * 0.0078125 + fVar9;
  gui->UVArray[(int)(uVar2 + 2)] = fVar8;
  gui->UVArray[(int)(uVar2 + 3)] = fVar10;
  gui->UVArray[(int)(uVar2 + 4)] = fVar9;
  fVar10 = (float)src.h * 0.0078125 + fVar10;
  gui->UVArray[(int)(uVar2 + 5)] = fVar10;
  gui->UVArray[(int)(uVar2 + 6)] = fVar8;
  fVar8 = (float)dst.x;
  fVar9 = (float)dst.y;
  gui->UVArray[(int)(uVar2 | 7)] = fVar10;
  gui->VertexArray[lVar4 * 8] = fVar8;
  gui->VertexArray[(int)(uVar2 + 1)] = fVar9;
  fVar10 = (float)(dst.w + dst.x);
  gui->VertexArray[(int)(uVar2 + 2)] = fVar10;
  gui->VertexArray[(int)(uVar2 + 3)] = fVar9;
  gui->VertexArray[(int)(uVar2 + 4)] = fVar8;
  fVar8 = (float)(dst.h + dst.y);
  gui->VertexArray[(int)(uVar2 + 5)] = fVar8;
  gui->VertexArray[(int)(uVar2 + 6)] = fVar10;
  gui->VertexArray[(int)(uVar2 | 7)] = fVar8;
  lVar6 = lVar4 * 0x10;
  *(mu_Color *)(gui->ColorArray + lVar6) = color;
  *(mu_Color *)(gui->ColorArray + lVar6 + 4) = color;
  *(mu_Color *)(gui->ColorArray + lVar6 + 8) = color;
  *(mu_Color *)(gui->ColorArray + lVar6 + 0xc) = color;
  iVar3 = iVar1 * 6;
  uVar7 = iVar1 * 4 + 1;
  gui->IndexArray[lVar4 * 6] = iVar1 * 4;
  gui->IndexArray[iVar3 + 1] = uVar7;
  uVar5 = iVar1 * 4 + 2;
  gui->IndexArray[(long)iVar3 + 2] = uVar5;
  gui->IndexArray[(long)iVar3 + 3] = uVar5;
  gui->IndexArray[(long)iVar3 + 4] = iVar1 * 4 + 3;
  gui->IndexArray[(long)iVar3 + 5] = uVar7;
  return;
}

Assistant:

static void PushQuad(GUI* gui, mu_Rect dst, mu_Rect src, mu_Color color) {
    if (gui->QuadCount == BUFFER_SIZE) {
        Render(gui);
    }

    int texvert_idx = gui->QuadCount * 8;
    int color_idx = gui->QuadCount * 16;
    int element_idx = gui->QuadCount * 4;
    int index_idx = gui->QuadCount * 6;
    gui->QuadCount++;

    float x = src.x / (float) ATLAS_WIDTH;
    float y = src.y / (float) ATLAS_HEIGHT;
    float w = src.w / (float) ATLAS_WIDTH;
    float h = src.h / (float) ATLAS_HEIGHT;
    gui->UVArray[texvert_idx + 0] = x;
    gui->UVArray[texvert_idx + 1] = y;
    gui->UVArray[texvert_idx + 2] = x + w;
    gui->UVArray[texvert_idx + 3] = y;
    gui->UVArray[texvert_idx + 4] = x;
    gui->UVArray[texvert_idx + 5] = y + h;
    gui->UVArray[texvert_idx + 6] = x + w;
    gui->UVArray[texvert_idx + 7] = y + h;

    gui->VertexArray[texvert_idx + 0] = dst.x;
    gui->VertexArray[texvert_idx + 1] = dst.y;
    gui->VertexArray[texvert_idx + 2] = dst.x + dst.w;
    gui->VertexArray[texvert_idx + 3] = dst.y;
    gui->VertexArray[texvert_idx + 4] = dst.x;
    gui->VertexArray[texvert_idx + 5] = dst.y + dst.h;
    gui->VertexArray[texvert_idx + 6] = dst.x + dst.w;
    gui->VertexArray[texvert_idx + 7] = dst.y + dst.h;

    memcpy(gui->ColorArray + color_idx +  0, &color, 4);
    memcpy(gui->ColorArray + color_idx +  4, &color, 4);
    memcpy(gui->ColorArray + color_idx +  8, &color, 4);
    memcpy(gui->ColorArray + color_idx + 12, &color, 4);

    gui->IndexArray[index_idx + 0] = element_idx + 0;
    gui->IndexArray[index_idx + 1] = element_idx + 1;
    gui->IndexArray[index_idx + 2] = element_idx + 2;
    gui->IndexArray[index_idx + 3] = element_idx + 2;
    gui->IndexArray[index_idx + 4] = element_idx + 3;
    gui->IndexArray[index_idx + 5] = element_idx + 1;
}